

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::KMHNGram::backward_impl
          (KMHNGram *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  PointerType pfVar1;
  variable_if_dynamic<long,__1> vVar2;
  uint uVar3;
  Index size;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  variable_if_dynamic<long,__1> vVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [64];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  uVar3 = 1;
  if (1 < (dEdf->d).nd) {
    uVar3 = (dEdf->d).d[1];
  }
  if (0 < (int)uVar3) {
    lVar7 = 0;
    uVar12 = 0;
    do {
      if (this->n != 0) {
        uVar11 = uVar12 & 0xffffffff;
        uVar6 = 0;
        do {
          Tensor::operator*(&local_50,dEdf);
          vVar2.m_value =
               local_50.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          pfVar1 = local_50.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data;
          if (local_50.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value < 0 &&
              local_50.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data != (PointerType)0x0) {
            pcVar4 = 
            "Eigen::MapBase<Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, -1>>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, -1>>, -1, 1, true>, Level = 0]"
            ;
LAB_00177cd8:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar4);
          }
          if (local_50.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= (long)uVar12) {
            pcVar4 = 
            "Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, -1>>, -1, 1, true>::Block(XprType &, Index) [XprType = const Eigen::Map<Eigen::Matrix<float, -1, -1>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
            ;
LAB_00177d0e:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,pcVar4);
          }
          Tensor::operator*(&local_70,dEdxi);
          if (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value < 0 &&
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data != (PointerType)0x0) {
            pcVar4 = 
            "Eigen::MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, -1, 1, true>, Level = 0]"
            ;
            goto LAB_00177cd8;
          }
          uVar5 = (ulong)(uint)((int)uVar6 + (int)uVar12);
          if (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value <= (long)uVar5) {
            pcVar4 = 
            "Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
            ;
            goto LAB_00177d0e;
          }
          if (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value != vVar2.m_value) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>, -1, 1, true>, SrcXprType = Eigen::Block<const Eigen::Map<Eigen::Matrix<float, -1, -1>>, -1, 1, true>, Functor = Eigen::internal::add_assign_op<float, float>]"
                         );
          }
          vVar8.m_value =
               local_70.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          if ((((ulong)(local_70.
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_data +
                       uVar5 * local_70.
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                               .
                               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                               .m_rows.m_value) & 3) == 0) &&
             (vVar8.m_value =
                   (long)(-((uint)((ulong)(local_70.
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                           .
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                           .m_data +
                                          uVar5 * local_70.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_rows.m_value) >> 2) & 0x3fffffff) & 0xf),
             local_70.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value <= vVar8.m_value)) {
            vVar8.m_value =
                 local_70.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
          }
          uVar9 = local_70.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_rows.m_value - vVar8.m_value;
          uVar5 = uVar9 + 0xf;
          if (-1 < (long)uVar9) {
            uVar5 = uVar9;
          }
          if (0 < vVar8.m_value) {
            uVar10 = 0;
            do {
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data[local_70.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_rows.m_value * uVar11 + uVar10] =
                   local_70.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data[local_70.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value * uVar11 + uVar10] +
                   *(float *)((long)pfVar1 + uVar10 * 4 + lVar7 * vVar2.m_value);
              uVar10 = uVar10 + 1;
            } while (vVar8.m_value != uVar10);
          }
          uVar5 = (uVar5 & 0xfffffffffffffff0) + vVar8.m_value;
          if (0xf < (long)uVar9) {
            do {
              auVar13 = vaddps_avx512f(*(undefined1 (*) [64])
                                        (local_70.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data +
                                        local_70.
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                        .
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                        .m_rows.m_value * uVar11 + vVar8.m_value),
                                       *(undefined1 (*) [64])
                                        ((long)pfVar1 + vVar8.m_value * 4 + lVar7 * vVar2.m_value));
              *(undefined1 (*) [64])
               (local_70.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data +
               local_70.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value * uVar11 + vVar8.m_value) = auVar13;
              vVar8.m_value = vVar8.m_value + 0x10;
            } while (vVar8.m_value < (long)uVar5);
          }
          if ((long)uVar5 <
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value) {
            do {
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data[local_70.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_rows.m_value * uVar11 + uVar5] =
                   local_70.
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                   .
                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                   .m_data[local_70.
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           .
                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                           .m_rows.m_value * uVar11 + uVar5] +
                   *(float *)((long)pfVar1 + uVar5 * 4 + vVar2.m_value * lVar7);
              uVar5 = uVar5 + 1;
            } while (local_70.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value != uVar5);
          }
          uVar6 = uVar6 + 1;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (uVar6 < this->n);
      }
      uVar12 = uVar12 + 1;
      lVar7 = lVar7 + 4;
    } while (uVar12 != uVar3);
  }
  return;
}

Assistant:

void KMHNGram::backward_impl(const vector<const Tensor*>& xs,
                        const Tensor& fx,
                        const Tensor& dEdf,
                        unsigned i,
                        Tensor& dEdxi) const {
  const int c = dEdf.d.cols();
  for (int j = 0; j < c; ++j)
    for (unsigned k = 0; k < n; ++k)
      (*dEdxi).col(j+k) += (*dEdf).col(j);
}